

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

void __thiscall DataRefs::UpdateXPSimTime(DataRefs *this)

{
  int iVar1;
  long lVar2;
  double *pdVar3;
  time_t *in_RDI;
  float fVar4;
  tm tm_future;
  time_t unix_t;
  time_t jan01;
  tm tm;
  time_t now;
  longlong zuluTime;
  longlong localTime;
  longlong t;
  longlong DAY_MS;
  tm *in_stack_ffffffffffffff50;
  int local_a4;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_4c;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  undefined8 local_10;
  
  local_10 = 86400000;
  iVar1 = GetLocalDateDays((DataRefs *)0x13b89c);
  local_18 = (long)iVar1 * 86400000;
  fVar4 = GetLocalTimeSec((DataRefs *)0x13b8b6);
  local_20 = (long)(fVar4 * 1000.0);
  fVar4 = GetZuluTimeSec((DataRefs *)0x13b8d8);
  local_28 = (long)(fVar4 * 1000.0);
  lVar2 = local_20 - local_28;
  if (lVar2 < 1) {
    lVar2 = -lVar2;
  }
  if (60000 < lVar2) {
    pdVar3 = positionTy::lon((positionTy *)(in_RDI + 0x191));
    if (*pdVar3 <= 0.0) {
      if (local_28 < local_20) {
        local_18 = local_18 + 86400000;
      }
    }
    else if (local_20 < local_28) {
      local_18 = local_18 + -86400000;
    }
  }
  local_18 = local_28 + local_18;
  time(&local_30);
  gmtime_s(in_stack_ffffffffffffff50,in_RDI);
  local_18 = ((((local_30 - local_4c * 0x15180) - (long)(local_60 * 0xe10)) -
              (long)(local_64 * 0x3c)) - (long)local_68) * 1000 + local_18;
  lVar2 = (local_30 + 1) * 1000;
  if (local_18 != lVar2 && SBORROW8(local_18,lVar2) == local_18 + (local_30 + 1) * -1000 < 0) {
    gmtime_s(in_stack_ffffffffffffff50,in_RDI);
    local_18 = local_18 + -0x757b12c00;
    gmtime_s(in_stack_ffffffffffffff50,in_RDI);
    if (local_5c != local_a4) {
      local_18 = local_18 + -86400000;
    }
  }
  in_RDI[399] = local_18;
  return;
}

Assistant:

void DataRefs::UpdateXPSimTime()
{
    // convert all numbers right away to milliseconds as we need that in the end anyway
    // and that way we preserve the meaning of the fractional seconds coming from X-Plane
    constexpr long long DAY_MS = 24LL * 60LL * 60LL * 1000LL;
    long long t = (long long)(GetLocalDateDays()) * DAY_MS;
    const long long localTime = (long long)(GetLocalTimeSec() * 1000.0f);
    const long long zuluTime =  (long long)(GetZuluTimeSec()  * 1000.0f);
    // if local and zulu time are different at all (testing for more than one minute difference)
    if (std::llabs(localTime - zuluTime) > 60000LL) {
        // Eastern hemisphere? -> Zulu is _behind_ local time
        if (lastUsersPlanePos.lon() > 0.0) {
            // but if the local Zulu time component is actually _ahead of_ local time, then need to decrement zulu date
            if (zuluTime > localTime)
                t -= DAY_MS;
        } else {
            // Western hemisphere -> Zulu is _ahead of_ local time
            // but if the zulu time component is actually _behind_ local time, then need to increment zulu date
            if (zuluTime < localTime)
                t += DAY_MS;
        }
    }
    // Now t is date in zulu days, just add time component
    t += zuluTime;
    
    // Last thing to do: Add the beginning of the right year to it
    // Complications: X-Plane has no notion of a "year", it just returns days since start of the year
    //                X-Plane offers only 28 days for February, so it runs on a 365d year
    //                If the day of the year is past current real life day of year, then assume "last year"
    //                But: What do we do with leap years in reality???
    
    // Find this year's beginning
    time_t now;
    std::tm tm;
    time(&now);                     // today, actually 'now'
    gmtime_s(&tm, &now);
    // to get to jan01 of the same year reduce by all the days of the year and current time
    const time_t jan01 = now - tm.tm_yday * 24*60*60
                             - tm.tm_hour *    60*60
                             - tm.tm_min  *       60
                             - tm.tm_sec;
    
    // Convert to milliseconds, then add to our result
    t += (long long)(jan01) * 1000LL;
    
    // if t is now (more than 1s) in the future, then we reduce t by an entire year,
    // supposingly pointing to the same day last year
    if (t > (long long)(now+1) * 1000LL) {
        // Save a date representation of what we computed so far in the future
        time_t unix_t = time_t(t / 1000LL);
        std::tm tm_future;
        gmtime_s(&tm_future, &unix_t);
        
        // reduce by 365 days
        t -= 365LL * DAY_MS;
        
        // Would we need to skip over a leap year's 29th Feb?
        // Goal is: We need to end up on the same day of the month,
        //          so convert back to calendar days and let's check
        unix_t = time_t(t / 1000LL);
        gmtime_s(&tm, &unix_t);
        // If day of month don't agree then reduce by another day to cover leap day
        if (tm.tm_mday != tm_future.tm_mday)
            t -= DAY_MS;
    }
    
    // Done: store as our last calculate value
    lastXPSimTime_ms = (long long)t;
}